

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O3

void anon_unknown.dwarf_ae217::TextRegBits<(anonymous_namespace)::IntArg>
               (Emulator *e,u8 v,BitArg arg,IntArg args)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  uVar3 = (uint)arg.mask & (uint)e;
  uVar4 = (uint)(uVar3 == 0);
  if (arg.invert == false) {
    uVar4 = uVar3;
  }
  pcVar1 = (&arg.true_text)[uVar4 == 0];
  if (*pcVar1 != '\0') {
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("%s",pcVar1);
    pcVar1 = arg.tooltip;
    if (arg.tooltip != (char *)0x0) {
      bVar2 = ImGui::IsItemHovered(0);
      if (bVar2) {
        ImGui::SetTooltip(pcVar1);
      }
    }
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%s:%d ",CONCAT71(in_register_00000031,v),
              (ulong)(((uint)e & 0xff & (uint)args.text) >> (args.text._4_1_ & 0x1f)));
  return;
}

Assistant:

void TextRegBits(Emulator* e, u8 v, BitArg arg, Args... args) {
  u8 masked = v & arg.mask;
  bool is_set = arg.invert ? !masked : masked;
  const char* text = is_set ? arg.true_text : arg.false_text;
  if (strlen(text) != 0) {
    ImGui::SameLine();
    ImGui::Text("%s", text);
    if (arg.tooltip && ImGui::IsItemHovered()) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  TextRegBits(e, v, args...);
}